

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::MakeIfdefGuardIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view header_path)

{
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *this_00;
  string_view s;
  AlphaNum local_168;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_128;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_c8;
  undefined8 local_c0;
  _anonymous_namespace_ *local_b8;
  size_t sStack_b0;
  string local_a0 [32];
  undefined1 local_80 [16];
  string local_70;
  AlphaNum local_50;
  _anonymous_namespace_ *p_Stack_20;
  string_view header_path_local;
  
  sStack_b0 = header_path._M_len;
  this_00 = &local_128;
  local_b8 = this;
  p_Stack_20 = this;
  header_path_local._M_len = sStack_b0;
  header_path_local._M_str = (char *)__return_storage_ptr__;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (this_00,(char (*) [2])0x621f1f,(char (*) [2])0x6bc912);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_108,(char (*) [2])0x6da370,(char (*) [2])0x6bc912);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_e8,(char (*) [2])0x554a83,(char (*) [2])0x6bc912);
  local_c0 = 3;
  local_c8 = this_00;
  absl::lts_20240722::StrReplaceAll_abi_cxx11_(local_a0,local_b8,sStack_b0,this_00,3);
  local_80 = std::__cxx11::string::operator_cast_to_basic_string_view(local_a0);
  s._M_len = local_80._8_8_;
  s._M_str = (char *)this_00;
  absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(&local_70,local_80._0_8_,s);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_50,&local_70);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_168,"_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string MakeIfdefGuardIdentifier(const absl::string_view header_path) {
  return absl::StrCat(absl::AsciiStrToUpper(absl::StrReplaceAll(header_path,
                                                                {
                                                                    {"/", "_"},
                                                                    {".", "_"},
                                                                    {"-", "_"},
                                                                })),
                      "_");
}